

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void uxpgnt_log(PageantListenerClient *plc,char *fmt,__va_list_tag *ap)

{
  _Bool *p_Var1;
  uxpgnt_client *upc;
  __va_list_tag *ap_local;
  char *fmt_local;
  PageantListenerClient *plc_local;
  
  p_Var1 = &plc[-3].suppress_logging;
  if (*(long *)p_Var1 != 0) {
    fprintf(*(FILE **)p_Var1,"pageant: ");
    vfprintf(*(FILE **)p_Var1,fmt,ap);
    fprintf(*(FILE **)p_Var1,"\n");
  }
  return;
}

Assistant:

static void uxpgnt_log(PageantListenerClient *plc, const char *fmt, va_list ap)
{
    struct uxpgnt_client *upc = container_of(plc, struct uxpgnt_client, plc);

    if (!upc->logfp)
        return;

    fprintf(upc->logfp, "pageant: ");
    vfprintf(upc->logfp, fmt, ap);
    fprintf(upc->logfp, "\n");
}